

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.hpp
# Opt level: O2

void __thiscall MC::MC_Driver::oppop(MC_Driver *this,int op)

{
  condition cl;
  string c;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_74;
  int local_70;
  int local_68;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  int local_40;
  float local_3c;
  string local_38 [32];
  
  std::__cxx11::string::string
            (local_38,(string *)
                      ((this->condStack).colunm.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)(this->condStack).top + -1)
            );
  local_98._M_p = (pointer)&local_88;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_98);
  local_74 = (this->condStack).stackTopType;
  local_70 = op;
  local_68 = local_74;
  if (local_74 == 90000) {
    local_3c = (this->condStack).tempFloat;
  }
  else if (local_74 == 50000) {
    local_40 = (this->condStack).tempInt;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_60);
  }
  std::vector<condition,_std::allocator<condition>_>::push_back
            (this->stmt->c_list,(value_type *)local_a0);
  condition::~condition((condition *)local_a0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void oppop(int op){
        std::string c = condStack.colunm[condStack.top-1];
        struct condition cl;
        cl.colunmName = c;
        cl.op = op;
        cl.type = condStack.stackTopType;
        cl.key.type = condStack.stackTopType;
        if(condStack.stackTopType == 50000){
            //int
            cl.key.intV = condStack.tempInt;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.intV<<std::endl;
        }else if(condStack.stackTopType == 90000){
            //float
            cl.key.floatV = condStack.tempFloat;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.floatV<<std::endl;
        }else{
            //string
            cl.key.charV = condStack.tempString;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.charV<<std::endl;
        }
        
    }